

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

bool CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse
               (ConstStringParam name,TreeEnsembleParameters_TreeNode_TreeNodeBehavior *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior local_1c;
  bool success;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior *pTStack_18;
  int int_value;
  TreeEnsembleParameters_TreeNode_TreeNodeBehavior *value_local;
  ConstStringParam name_local;
  
  pTStack_18 = value;
  value_local = (TreeEnsembleParameters_TreeNode_TreeNodeBehavior *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries,
                     (EnumEntry *)0x7,(size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pTStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool TreeEnsembleParameters_TreeNode_TreeNodeBehavior_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TreeEnsembleParameters_TreeNode_TreeNodeBehavior* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TreeEnsembleParameters_TreeNode_TreeNodeBehavior_entries, 7, name, &int_value);
  if (success) {
    *value = static_cast<TreeEnsembleParameters_TreeNode_TreeNodeBehavior>(int_value);
  }
  return success;
}